

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::TimingPathSymbol::serializeTo(TimingPathSymbol *this,ASTSerializer *serializer)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  bool bVar1;
  reference ppEVar2;
  TimingPathSymbol *in_RSI;
  long in_RDI;
  Expression *expr_4;
  iterator __end2_2;
  iterator __begin2_2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2_2;
  Expression *expr_3;
  iterator __end2_1;
  iterator __begin2_1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2_1;
  Expression *expr_2;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  Expression *expr_1;
  Expression *expr;
  TimingPathSymbol *in_stack_fffffffffffffe18;
  TimingPathSymbol *pTVar3;
  TimingPathSymbol *in_stack_fffffffffffffe20;
  TimingPathSymbol *this_00;
  char *in_stack_fffffffffffffe28;
  TimingPathSymbol *in_stack_fffffffffffffe30;
  TimingPathSymbol *in_stack_fffffffffffffe38;
  TimingPathSymbol *this_01;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_180;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_178;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_168;
  Expression *local_150;
  Expression **local_148;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_140;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_138;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_128;
  Expression *local_110;
  Expression **local_108;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_100;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_f8;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_e8;
  int local_d0;
  void *local_c8;
  Expression *local_c0;
  int local_b8;
  void *local_b0;
  Expression *local_a8;
  int local_a0;
  void *local_98;
  string_view local_90;
  int local_80;
  void *local_78;
  string_view local_70;
  int local_60;
  void *local_58;
  string_view local_50;
  int local_40;
  void *local_38;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  int local_20;
  void *local_18;
  TimingPathSymbol *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28);
  if (*(int *)(in_RDI + 0x40) == 0) {
    local_30 = ::sv((char *)in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18);
  }
  else {
    local_30 = ::sv((char *)in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18);
  }
  ASTSerializer::write((ASTSerializer *)in_RSI,local_20,local_18,local_30._M_len);
  this_01 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28);
  local_50 = ast::toString(Unknown);
  ASTSerializer::write((ASTSerializer *)this_01,local_40,local_38,local_50._M_len);
  pTVar3 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28);
  local_70 = ast::toString(Unknown);
  ASTSerializer::write((ASTSerializer *)pTVar3,local_60,local_58,local_70._M_len);
  pTVar3 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28);
  local_90 = ast::toString(None);
  ASTSerializer::write((ASTSerializer *)pTVar3,local_80,local_78,local_90._M_len);
  pTVar3 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28);
  ASTSerializer::write
            ((ASTSerializer *)pTVar3,local_a0,local_98,(ulong)(*(byte *)(in_RDI + 0x50) & 1));
  local_a8 = getEdgeSourceExpr(in_stack_fffffffffffffe20);
  if (local_a8 != (Expression *)0x0) {
    in_stack_fffffffffffffe38 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe30,
               in_stack_fffffffffffffe28);
    ASTSerializer::write
              ((ASTSerializer *)in_stack_fffffffffffffe38,local_b8,local_b0,(size_t)local_a8);
  }
  local_c0 = getConditionExpr(in_stack_fffffffffffffe20);
  if (local_c0 != (Expression *)0x0) {
    in_stack_fffffffffffffe30 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_10,
               in_stack_fffffffffffffe28);
    ASTSerializer::write
              ((ASTSerializer *)in_stack_fffffffffffffe30,local_d0,local_c8,(size_t)local_c0);
  }
  pTVar3 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe30,
             (char *)local_10);
  name._M_str = (char *)this_01;
  name._M_len = (size_t)in_stack_fffffffffffffe38;
  ASTSerializer::startArray((ASTSerializer *)in_stack_fffffffffffffe30,name);
  local_f8 = getInputs(in_stack_fffffffffffffe18);
  local_e8 = &local_f8;
  local_100._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffffe18);
  local_108 = (Expression **)
              std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                        ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)pTVar3
                        );
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffe20,
                       (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffe18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ::operator*(&local_100);
    local_110 = *ppEVar2;
    ASTSerializer::serialize
              ((ASTSerializer *)in_stack_fffffffffffffe20,(Expression *)in_stack_fffffffffffffe18);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(&local_100);
  }
  ASTSerializer::endArray((ASTSerializer *)0x1098093);
  this_00 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe30,
             (char *)pTVar3);
  name_00._M_str = (char *)this_01;
  name_00._M_len = (size_t)in_stack_fffffffffffffe38;
  ASTSerializer::startArray((ASTSerializer *)in_stack_fffffffffffffe30,name_00);
  local_138 = getOutputs(in_stack_fffffffffffffe18);
  local_128 = &local_138;
  local_140._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffffe18);
  local_148 = (Expression **)
              std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                        ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)pTVar3
                        );
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffe18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ::operator*(&local_140);
    local_150 = *ppEVar2;
    ASTSerializer::serialize((ASTSerializer *)this_00,(Expression *)in_stack_fffffffffffffe18);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(&local_140);
  }
  ASTSerializer::endArray((ASTSerializer *)0x1098188);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe30,
             (char *)pTVar3);
  name_01._M_str = (char *)this_01;
  name_01._M_len = (size_t)in_stack_fffffffffffffe38;
  ASTSerializer::startArray((ASTSerializer *)in_stack_fffffffffffffe30,name_01);
  local_178 = getDelays(local_10);
  local_168 = &local_178;
  local_180._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)local_10);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)pTVar3);
  pTVar3 = local_10;
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)pTVar3);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator*(&local_180);
    ASTSerializer::serialize((ASTSerializer *)this_00,(Expression *)pTVar3);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(&local_180);
  }
  ASTSerializer::endArray((ASTSerializer *)0x109825a);
  return;
}

Assistant:

void TimingPathSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("connectionKind",
                     connectionKind == ConnectionKind::Full ? "Full"sv : "Parallel"sv);
    serializer.write("polarity", toString(polarity));
    serializer.write("edgePolarity", toString(edgePolarity));
    serializer.write("edgeIdentifier", toString(edgeIdentifier));
    serializer.write("isStateDependent", isStateDependent);

    if (auto expr = getEdgeSourceExpr())
        serializer.write("edgeSourceExpr", *expr);

    if (auto expr = getConditionExpr())
        serializer.write("conditionExpr", *expr);

    serializer.startArray("inputs");
    for (auto expr : getInputs())
        serializer.serialize(*expr);
    serializer.endArray();

    serializer.startArray("outputs");
    for (auto expr : getOutputs())
        serializer.serialize(*expr);
    serializer.endArray();

    serializer.startArray("delays");
    for (auto expr : getDelays())
        serializer.serialize(*expr);
    serializer.endArray();
}